

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O1

string * fineftp::Filesystem::cleanPath
                   (string *__return_storage_ptr__,string *path,bool windows_path,
                   char output_separator)

{
  ostream *poVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  bool bVar3;
  int iVar4;
  long lVar5;
  _Node *p_Var6;
  _List_node_base *p_Var7;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  char *pcVar8;
  ulong uVar9;
  string *psVar10;
  regex win_local_drive;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  string absolute_root;
  stringstream path_ss;
  undefined1 local_228 [8];
  _List_node_base *local_220;
  _List_node_base local_218;
  undefined4 local_208;
  undefined4 local_204;
  undefined1 local_200 [16];
  element_type *local_1f0;
  char *local_1e0;
  ulong local_1d8;
  char local_1d0;
  undefined7 uStack_1cf;
  string *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_208 = (undefined4)CONCAT71(in_register_00000009,output_separator);
  if (path->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,".","");
    return __return_storage_ptr__;
  }
  local_204 = (undefined4)CONCAT71(in_register_00000011,windows_path);
  local_1e0 = &local_1d0;
  local_1d8 = 0;
  local_1d0 = '\0';
  local_1c0 = __return_storage_ptr__;
  if (windows_path) {
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_228,"^[a-zA-Z]\\:",0x10
              );
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_200,
               "^[/\\\\]{2}[^/\\\\]+",0x10);
    _Var2._M_current = (path->_M_dataplus)._M_p;
    local_1a8[0]._M_allocated_capacity = (pointer)0x0;
    local_1a8[0]._8_8_ = (char *)0x0;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    bVar3 = ::std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(_Var2._M_current + path->_M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_1b8,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_228,0);
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity - local_1b8._0_8_);
    }
    if (bVar3) {
      ::std::__cxx11::string::substr((ulong)local_1b8,(ulong)path);
LAB_00128394:
      ::std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_1b8);
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
      }
    }
    else {
      _Var2._M_current = (path->_M_dataplus)._M_p;
      local_1a8[0]._M_allocated_capacity = (pointer)0x0;
      local_1a8[0]._8_8_ = (char *)0x0;
      local_1b8._0_8_ = (pointer)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      bVar3 = ::std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var2._M_current + path->_M_string_length),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_1b8,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_200,0);
      if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity - local_1b8._0_8_
                       );
      }
      if (bVar3) {
        ::std::__cxx11::string::find_first_of((char *)path,0x1397b6,2);
        ::std::__cxx11::string::substr((ulong)local_1b8,(ulong)path);
        goto LAB_00128394;
      }
    }
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_200);
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_228);
  }
  else if (*(path->_M_dataplus)._M_p == '/') {
    ::std::__cxx11::string::_M_replace_aux((ulong)&local_1e0,0,0,'\x01');
  }
  local_200._0_8_ = local_200;
  local_1f0 = (element_type *)0x0;
  local_200._8_8_ = local_200._0_8_;
  if (local_1d8 + 1 <= path->_M_string_length) {
    uVar9 = local_1d8;
    do {
      if ((char)local_204 == '\0') {
        pcVar8 = "/";
      }
      else {
        pcVar8 = "/\\";
      }
      lVar5 = ::std::__cxx11::string::find_first_of((char *)path,(ulong)pcVar8,uVar9);
      local_1b8._0_8_ = local_1b8 + 0x10;
      local_1b8._8_8_ = (pointer)0x0;
      local_1a8[0]._M_allocated_capacity = local_1a8[0]._M_allocated_capacity & 0xffffffffffffff00;
      if (lVar5 == -1) {
        ::std::__cxx11::string::substr((ulong)local_228,(ulong)path);
      }
      else {
        ::std::__cxx11::string::substr((ulong)local_228,(ulong)path);
      }
      ::std::__cxx11::string::operator=((string *)local_1b8,(string *)local_228);
      if (local_228 != (undefined1  [8])&local_218) {
        operator_delete((void *)local_228,
                        CONCAT71(local_218._M_next._1_7_,local_218._M_next._0_1_) + 1);
      }
      if (((pointer)local_1b8._8_8_ != (pointer)0x0) &&
         (iVar4 = ::std::__cxx11::string::compare((char *)local_1b8), iVar4 != 0)) {
        iVar4 = ::std::__cxx11::string::compare((char *)local_1b8);
        if (iVar4 == 0) {
          if (local_1d8 == 0) {
            if (((_List_node_base *)local_200._0_8_ != (_List_node_base *)local_200) &&
               (iVar4 = ::std::__cxx11::string::compare((char *)(local_200._8_8_ + 0x10)),
               iVar4 != 0)) goto LAB_0012855a;
            local_228 = (undefined1  [8])&local_218;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"..","");
            p_Var7 = (_List_node_base *)operator_new(0x30);
            p_Var7[1]._M_next = p_Var7 + 2;
            if (local_228 == (undefined1  [8])&local_218) {
              p_Var7[2]._M_next =
                   (_List_node_base *)CONCAT71(local_218._M_next._1_7_,local_218._M_next._0_1_);
              p_Var7[2]._M_prev = local_218._M_prev;
            }
            else {
              p_Var7[1]._M_next = (_List_node_base *)local_228;
              p_Var7[2]._M_next =
                   (_List_node_base *)CONCAT71(local_218._M_next._1_7_,local_218._M_next._0_1_);
            }
            p_Var7[1]._M_prev = local_220;
            local_220 = (_List_node_base *)0x0;
            local_218._M_next._0_1_ = 0;
            local_228 = (undefined1  [8])&local_218;
            ::std::__detail::_List_node_base::_M_hook(p_Var7);
            local_1f0 = (element_type *)
                        ((long)&(local_1f0->super__NFA_base)._M_paren_stack.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
            if (local_228 != (undefined1  [8])&local_218) {
              operator_delete((void *)local_228,
                              CONCAT71(local_218._M_next._1_7_,local_218._M_next._0_1_) + 1);
            }
          }
          else if ((_List_node_base *)local_200._0_8_ != (_List_node_base *)local_200) {
LAB_0012855a:
            ::std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_200,(iterator)local_200._8_8_);
          }
        }
        else {
          p_Var6 = ::std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                   _M_create_node<std::__cxx11::string_const&>
                             ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                              local_200,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1b8);
          ::std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
          local_1f0 = (element_type *)
                      ((long)&(local_1f0->super__NFA_base)._M_paren_stack.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1);
        }
      }
      if (lVar5 != -1) {
        uVar9 = lVar5 + 1;
      }
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
      }
      psVar10 = local_1c0;
    } while ((lVar5 != -1) && (uVar9 < path->_M_string_length));
    if (local_1d8 == 0 && local_1f0 == (element_type *)0x0) {
      (local_1c0->_M_dataplus)._M_p = (pointer)&local_1c0->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,".","");
      goto LAB_0012873d;
    }
  }
  ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar1 = (ostream *)(local_1b8 + 0x10);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1e0,local_1d8);
  p_Var7 = (_List_node_base *)local_200;
  psVar10 = local_1c0;
  if (((char)local_204 != '\0') && (local_1d8 != 0)) {
    local_228[0] = (char)local_208;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_228,1);
    psVar10 = local_1c0;
  }
  while (p_Var7 = p_Var7->_M_next, p_Var7 != (_List_node_base *)local_200) {
    if (p_Var7 != (_List_node_base *)local_200._0_8_) {
      local_228[0] = (char)local_208;
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_228,1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(char *)p_Var7[1]._M_next,(long)p_Var7[1]._M_prev);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  ::std::ios_base::~ios_base(local_138);
LAB_0012873d:
  ::std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_200);
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
  }
  return psVar10;
}

Assistant:

std::string cleanPath(const std::string& path, bool windows_path, const char output_separator)
  {
    if (path.empty())
    {
      return ".";
    }

    // Find the root for absolute paths

    std::string absolute_root;

    if (windows_path)
    {
      /* On Windows, a root folder can be:
       *    C:\
       *    //Host
       *    \\Host
       */

      std::regex win_local_drive("^[a-zA-Z]\\:");                // Local drive
      std::regex win_network_drive("^[/\\\\]{2}[^/\\\\]+");      // Network path starting with two slashes or backslashes followed by a hostname

      if (std::regex_search(path, win_local_drive))
      {
        // Windows local drive, consisting of drive-letter and colon
        absolute_root = path.substr(0, 2);
      }
      else if (std::regex_search(path, win_network_drive))
      {
        // Window network drive, consisting of \\ and hostname
        size_t sep_pos = path.find_first_of("/\\", 2);
        absolute_root = path.substr(0, sep_pos); // If no seperator was found, this will return the entire string
      }
    }
    else
    {
      // On Unix there is only one root and it is '/'
      if (path[0] == '/')
      {
        absolute_root = '/';
      }
    }

    // Split the path
    std::list<std::string> components;

    if (path.size() >= (absolute_root.size() + 1))
    {
      size_t start, end;
      
      if (absolute_root.empty())
        start = 0;
      else
        start = absolute_root.size();

      do
      {
        if (windows_path)
          end = path.find_first_of("/\\", start);
        else
          end = path.find_first_of("/", start);

        std::string this_component;
        if (end == std::string::npos)
          this_component = path.substr(start);
        else
          this_component = path.substr(start, end - start);
        
        // The components-stack that will increase and shrink depending on the folders and .. elements in the splitted path
        if (this_component.empty() || (this_component == "."))
        {
        }
        else if (this_component == "..")
        {
          if (!absolute_root.empty())
          {
            if (!components.empty())
            {
              // Move one folder up if we are not already at the root
              components.pop_back();
            }
          }
          else
          {
            if (!components.empty() && (components.back() != ".."))
            {
              // Move one folder up by removing it. We must not remove ".." elements that we were not able to resolve previously.
              components.pop_back();
            }
            else
            {
              components.push_back("..");
            }
          }
        }
        else
        {
          components.push_back(this_component);
        }

        if (end == std::string::npos)
          break;
        else
          start = end + 1;

      } while (start < path.size());

      // Join the components again
      if (components.size() == 0 && absolute_root.empty())
      {
          return ".";
      }
    }

    std::stringstream path_ss;
    path_ss << absolute_root;

    if (windows_path && !absolute_root.empty())
    {
      path_ss << output_separator; // The windows drive must be followed by a separator. When referencing a network drive.
    }

    auto comp_it = components.begin();
    while (comp_it != components.end())
    {
      if (comp_it != components.begin())
        path_ss << output_separator;
      
      path_ss << *comp_it;

      comp_it++;
    }

    return path_ss.str();
  }